

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDelay.c
# Opt level: O1

int If_CutSopBalanceEval(If_Man_t *p,If_Cut_t *pCut,Vec_Int_t *vAig)

{
  uint uVar1;
  float fVar2;
  uint uVar3;
  Vec_Ptr_t *pVVar4;
  int iVar5;
  uint nLeaves;
  Vec_Int_t *pVVar6;
  ulong uVar7;
  int Area;
  int pTimes [15];
  uint local_5c;
  int local_58 [16];
  
  pCut->field_0x1d = pCut->field_0x1d | 0x20;
  if (vAig != (Vec_Int_t *)0x0) {
    vAig->nSize = 0;
  }
  uVar1 = *(uint *)&pCut->field_0x1c;
  if (uVar1 < 0x1000000) {
    uVar1 = pCut->iCutFunc;
    if (-1 < (int)uVar1) {
      if (uVar1 < 2) {
        if (vAig != (Vec_Int_t *)0x0) {
          Vec_IntPush(vAig,uVar1);
        }
        *(uint *)&pCut->field_0x1c = *(uint *)&pCut->field_0x1c & 0xfffff000;
        return 0;
      }
      __assert_fail("Abc_Lit2Var(If_CutTruthLit(pCut)) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDelay.c"
                    ,0xff,"int If_CutSopBalanceEval(If_Man_t *, If_Cut_t *, Vec_Int_t *)");
    }
  }
  else {
    nLeaves = uVar1 >> 0x18;
    if (nLeaves == 1) {
      if (-1 < pCut->iCutFunc) {
        if ((pCut->iCutFunc & 0x7ffffffeU) != 2) {
          __assert_fail("Abc_Lit2Var(If_CutTruthLit(pCut)) == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDelay.c"
                        ,0x107,"int If_CutSopBalanceEval(If_Man_t *, If_Cut_t *, Vec_Int_t *)");
        }
        if (vAig != (Vec_Int_t *)0x0) {
          Vec_IntPush(vAig,0);
          if (pCut->iCutFunc < 0) goto LAB_0041ce0b;
          Vec_IntPush(vAig,pCut->iCutFunc & 1);
        }
        uVar1 = *(uint *)&pCut->field_0x1c;
        *(uint *)&pCut->field_0x1c = uVar1 & 0xfffff000;
        if (uVar1 < 0x1000000) {
          __assert_fail("i >= 0 && i < (int)pCut->nLeaves",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/if.h"
                        ,0x19b,"If_Obj_t *If_CutLeaf(If_Man_t *, If_Cut_t *, int)");
        }
        fVar2 = pCut[1].Area;
        if ((-1 < (long)(int)fVar2) && ((int)fVar2 < p->vObjs->nSize)) {
          return (int)*(float *)((long)p->vObjs->pArray[(int)fVar2] + 0x5c);
        }
LAB_0041cdec:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
    }
    else {
      uVar3 = pCut->iCutFunc;
      if (-1 < (int)uVar3) {
        if (p->vTtIsops[nLeaves]->nSize <= (int)(uVar3 >> 1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        pVVar6 = p->vTtIsops[nLeaves]->pArray;
        local_5c = 0;
        if (pVVar6 == (Vec_Int_t *)0x0) {
          return -1;
        }
        pVVar6 = pVVar6 + (uVar3 >> 1);
        if (pVVar6->nSize < 1) {
          __assert_fail("Vec_IntSize(vCover) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDelay.c"
                        ,0x117,"int If_CutSopBalanceEval(If_Man_t *, If_Cut_t *, Vec_Int_t *)");
        }
        pVVar4 = p->vObjs;
        uVar7 = 0;
        while( true ) {
          fVar2 = (&pCut[1].Area)[uVar7];
          if (((long)(int)fVar2 < 0) || (pVVar4->nSize <= (int)fVar2)) break;
          local_58[uVar7] = (int)*(float *)((long)pVVar4->pArray[(int)fVar2] + 0x5c);
          uVar7 = uVar7 + 1;
          if (nLeaves == uVar7) {
            iVar5 = If_CutSopBalanceEvalIntInt
                              (pVVar6,nLeaves,local_58,vAig,(uVar1 >> 0xc ^ uVar3) & 1,
                               (int *)&local_5c);
            *(uint *)&pCut->field_0x1c = *(uint *)&pCut->field_0x1c & 0xfffff000 | local_5c & 0xfff;
            return iVar5;
          }
        }
        goto LAB_0041cdec;
      }
    }
  }
LAB_0041ce0b:
  __assert_fail("pCut->iCutFunc >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/if.h"
                ,0x1b4,"int If_CutTruthLit(If_Cut_t *)");
}

Assistant:

int If_CutSopBalanceEval( If_Man_t * p, If_Cut_t * pCut, Vec_Int_t * vAig )
{
    pCut->fUser = 1;
    if ( vAig )
        Vec_IntClear( vAig );
    if ( pCut->nLeaves == 0 ) // const
    {
        assert( Abc_Lit2Var(If_CutTruthLit(pCut)) == 0 );
        if ( vAig )
            Vec_IntPush( vAig, Abc_LitIsCompl(If_CutTruthLit(pCut)) );
        pCut->Cost = 0;
        return 0;
    }
    if ( pCut->nLeaves == 1 ) // variable
    {
        assert( Abc_Lit2Var(If_CutTruthLit(pCut)) == 1 );
        if ( vAig )
            Vec_IntPush( vAig, 0 );
        if ( vAig )
            Vec_IntPush( vAig, Abc_LitIsCompl(If_CutTruthLit(pCut)) );
        pCut->Cost = 0;
        return (int)If_ObjCutBest(If_CutLeaf(p, pCut, 0))->Delay;
    }
    else
    {
        int fVerbose = 0;
        Vec_Int_t * vCover = Vec_WecEntry( p->vTtIsops[pCut->nLeaves], Abc_Lit2Var(If_CutTruthLit(pCut)) );
        int Delay, Area = 0;
        int i, pTimes[IF_MAX_FUNC_LUTSIZE];
        if ( vCover == NULL )
            return -1;
        assert( Vec_IntSize(vCover) > 0 );
        for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
            pTimes[i] = (int)If_ObjCutBest(If_CutLeaf(p, pCut, i))->Delay; 
        Delay = If_CutSopBalanceEvalIntInt( vCover, If_CutLeaveNum(pCut), pTimes, vAig, Abc_LitIsCompl(If_CutTruthLit(pCut)) ^ pCut->fCompl, &Area );
        pCut->Cost = Area;
        if ( fVerbose )
        {
            int Max = 0, Two = 0;
            for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
                Max = Abc_MaxInt( Max, pTimes[i] );
            for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
                if ( pTimes[i] != Max )
                    Two = Abc_MaxInt( Two, pTimes[i] );
            if ( Two + 2 < Max && Max + 3 < Delay )
            {
                for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
                    printf( "%3d ", pTimes[i] );
                for ( ; i < p->pPars->nLutSize; i++ )
                    printf( "    " );
                printf( "-> %3d   ", Delay );
                Dau_DsdPrintFromTruth( If_CutTruthW(p, pCut), If_CutLeaveNum(pCut) );
                Kit_TruthIsopPrintCover( vCover, If_CutLeaveNum(pCut), Abc_LitIsCompl(If_CutTruthLit(pCut)) ^ pCut->fCompl );
                {
                    Vec_Int_t vIsop;
                    int pIsop[64];
                    vIsop.nCap = vIsop.nSize = Abc_Tt6Esop( *If_CutTruthW(p, pCut), pCut->nLeaves, pIsop );
                    vIsop.pArray = pIsop;
                    printf( "ESOP (%d -> %d)\n", Vec_IntSize(vCover), vIsop.nSize );
                    Kit_TruthIsopPrintCover( &vIsop, If_CutLeaveNum(pCut), 0 );
                }
                printf( "\n" );
            }
        }
        return Delay;
    }
}